

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,REF_GRID ref_grid)

{
  REF_SUBDIV pRVar1;
  REF_INT *pRVar2;
  int local_34;
  int local_30;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_SUBDIV ref_subdiv;
  REF_GRID ref_grid_local;
  REF_SUBDIV *ref_subdiv_ptr_local;
  
  pRVar1 = (REF_SUBDIV)malloc(0x30);
  *ref_subdiv_ptr = pRVar1;
  if (*ref_subdiv_ptr == (REF_SUBDIV)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x86,
           "ref_subdiv_create","malloc *ref_subdiv_ptr of REF_SUBDIV_STRUCT NULL");
    ref_subdiv_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_subdiv_ptr;
    pRVar1->grid = ref_grid;
    ref_subdiv_ptr_local._4_4_ = ref_edge_create(&pRVar1->edge,pRVar1->grid);
    if (ref_subdiv_ptr_local._4_4_ == 0) {
      if (pRVar1->edge->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x91,"ref_subdiv_create","malloc ref_subdiv->mark of REF_INT negative");
        ref_subdiv_ptr_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)pRVar1->edge->n << 2);
        pRVar1->mark = pRVar2;
        if (pRVar1->mark == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x91,"ref_subdiv_create","malloc ref_subdiv->mark of REF_INT NULL");
          ref_subdiv_ptr_local._4_4_ = 2;
        }
        else {
          for (local_30 = 0; local_30 < pRVar1->edge->n; local_30 = local_30 + 1) {
            pRVar1->mark[local_30] = 0;
          }
          if (pRVar1->edge->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x93,"ref_subdiv_create","malloc ref_subdiv->node of REF_INT negative");
            ref_subdiv_ptr_local._4_4_ = 1;
          }
          else {
            pRVar2 = (REF_INT *)malloc((long)pRVar1->edge->n << 2);
            pRVar1->node = pRVar2;
            if (pRVar1->node == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x93,"ref_subdiv_create","malloc ref_subdiv->node of REF_INT NULL");
              ref_subdiv_ptr_local._4_4_ = 2;
            }
            else {
              for (local_34 = 0; local_34 < pRVar1->edge->n; local_34 = local_34 + 1) {
                pRVar1->node[local_34] = -1;
              }
              pRVar1->allow_geometry = 1;
              pRVar1->new_mark_allowed = 1;
              pRVar1->instrument = 0;
              pRVar1->debug = 0;
              ref_subdiv_ptr_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x8e
             ,"ref_subdiv_create",(ulong)ref_subdiv_ptr_local._4_4_,"create edge");
    }
  }
  return ref_subdiv_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_create(REF_SUBDIV *ref_subdiv_ptr,
                                     REF_GRID ref_grid) {
  REF_SUBDIV ref_subdiv;

  ref_malloc(*ref_subdiv_ptr, 1, REF_SUBDIV_STRUCT);

  ref_subdiv = *ref_subdiv_ptr;

  ref_subdiv_grid(ref_subdiv) = ref_grid;

  RSS(ref_edge_create(&(ref_subdiv_edge(ref_subdiv)),
                      ref_subdiv_grid(ref_subdiv)),
      "create edge");

  ref_malloc_init(ref_subdiv->mark, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, 0);
  ref_malloc_init(ref_subdiv->node, ref_edge_n(ref_subdiv_edge(ref_subdiv)),
                  REF_INT, REF_EMPTY);

  ref_subdiv->allow_geometry = REF_TRUE;
  ref_subdiv->new_mark_allowed = REF_TRUE;

  ref_subdiv->instrument = REF_FALSE;
  ref_subdiv->debug = REF_FALSE;

  return REF_SUCCESS;
}